

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

JSON * chaiscript::json::JSONParser::parse_number
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  char cVar1;
  char __rhs;
  undefined1 *puVar2;
  type_conflict1 tVar3;
  bool bVar4;
  __index_type _Var5;
  int iVar6;
  long lVar7;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  int iVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  chaiscript *pcVar15;
  byte __c;
  ulong uVar16;
  size_type sVar17;
  double dVar18;
  double dVar19;
  string_view t_str;
  string val;
  string exp_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  size_type *local_b0;
  size_type local_a8;
  size_type local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Alloc_hider _Var14;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar16 = *offset;
  iVar13 = 1;
  if ((uVar16 < str->_M_string_length) && ((str->_M_dataplus)._M_p[uVar16] == '-')) {
    *offset = uVar16 + 1;
    iVar13 = -1;
  }
  uVar16 = *offset;
  bVar4 = false;
  __c = 0;
  if (uVar16 < str->_M_string_length) {
    bVar4 = false;
    do {
      *offset = uVar16 + 1;
      if (str->_M_string_length <= uVar16) goto LAB_00351d7a;
      __c = (str->_M_dataplus)._M_p[uVar16];
      if ((byte)(__c - 0x30) < 10) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_d0,__c);
      }
      else {
        if ((__c != 0x2e) || (bVar4)) break;
        bVar4 = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_d0,'.');
      }
      uVar16 = *offset;
    } while (uVar16 < str->_M_string_length);
  }
  puVar2 = (undefined1 *)*offset;
  bVar12 = (__c & 0xdf) != 0x45 || (undefined1 *)str->_M_string_length <= puVar2;
  _Var14._M_p = (pointer)(ulong)bVar12;
  if (bVar12) {
    dVar18 = 0.0;
    if (puVar2 < (undefined1 *)str->_M_string_length) {
      iVar6 = isspace((int)(char)__c);
      _Var14._M_p = (pointer)extraout_RDX_00;
      if ((iVar6 == 0) && (__c != 0x2c)) {
        dVar18 = 0.0;
        if ((__c != 0x5d) && (__c != 0x7d)) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"JSON ERROR: Number: unexpected character \'","");
          std::operator+(&local_50,&local_70,__c);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50,"\'");
          local_b0 = (size_type *)(pbVar9->_M_dataplus)._M_p;
          paVar11 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0 == paVar11) {
            local_a0 = paVar11->_M_allocated_capacity;
            uStack_98 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_b0 = &local_a0;
          }
          else {
            local_a0 = paVar11->_M_allocated_capacity;
          }
          local_a8 = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar8,(string *)&local_b0);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        dVar18 = 0.0;
      }
    }
  }
  else {
    *offset = (size_t)(puVar2 + 1);
    _Var14._M_p = (pointer)str->_M_string_length;
    if (_Var14._M_p <= puVar2) {
LAB_00351d7a:
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    cVar1 = puVar2[(long)(str->_M_dataplus)._M_p];
    if ((cVar1 != '+') && (cVar1 != '-')) {
      *offset = (size_t)puVar2;
    }
    while (uVar16 = *offset, uVar16 < str->_M_string_length) {
      *offset = uVar16 + 1;
      if (str->_M_string_length <= uVar16) goto LAB_00351d7a;
      __rhs = (str->_M_dataplus)._M_p[uVar16];
      if (9 < (byte)(__rhs - 0x30U)) {
        iVar6 = isspace((int)__rhs);
        _Var14._M_p = (pointer)extraout_RDX_01;
        if ((((iVar6 == 0) && (__rhs != ',')) && (__rhs != ']')) && (__rhs != '}')) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,
                     "JSON ERROR: Number: Expected a number for exponent, found \'","");
          std::operator+(&local_50,&local_70,__rhs);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50,"\'");
          local_b0 = (size_type *)(pbVar9->_M_dataplus)._M_p;
          paVar11 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0 == paVar11) {
            local_a0 = paVar11->_M_allocated_capacity;
            uStack_98 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_b0 = &local_a0;
          }
          else {
            local_a0 = paVar11->_M_allocated_capacity;
          }
          local_a8 = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar8,(string *)&local_b0);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_90,__rhs);
      _Var14._M_p = (pointer)extraout_RDX;
    }
    if (local_90._M_string_length == 0) {
      lVar10 = 0;
    }
    else {
      sVar17 = 0;
      lVar10 = 0;
      do {
        _Var14._M_p = local_90._M_dataplus._M_p;
        if (9 < (byte)(local_90._M_dataplus._M_p[sVar17] - 0x30U)) break;
        lVar10 = (ulong)((byte)local_90._M_dataplus._M_p[sVar17] & 0xf) + lVar10 * 10;
        sVar17 = sVar17 + 1;
      } while (local_90._M_string_length != sVar17);
    }
    lVar7 = -lVar10;
    if (cVar1 != '-') {
      lVar7 = lVar10;
    }
    dVar18 = (double)lVar7;
  }
  *offset = *offset - 1;
  if (bVar4) {
    t_str._M_str = _Var14._M_p;
    t_str._M_len = (size_t)local_d0._M_dataplus._M_p;
    tVar3 = parse_num<double>((chaiscript *)local_d0._M_string_length,t_str);
    dVar18 = pow(10.0,dVar18);
    *(double *)
     &(__return_storage_ptr__->internal).d.
      super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      .
      super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = dVar18 * tVar3 * (double)iVar13;
    _Var5 = '\x04';
  }
  else if (local_90._M_string_length == 0) {
    if ((chaiscript *)local_d0._M_string_length == (chaiscript *)0x0) {
      lVar10 = 0;
    }
    else {
      pcVar15 = (chaiscript *)0x0;
      lVar10 = 0;
      do {
        if (9 < (byte)(local_d0._M_dataplus._M_p[(long)pcVar15] - 0x30U)) break;
        lVar10 = (ulong)((byte)local_d0._M_dataplus._M_p[(long)pcVar15] & 0xf) + lVar10 * 10;
        pcVar15 = pcVar15 + 1;
      } while ((chaiscript *)local_d0._M_string_length != pcVar15);
    }
    *(long *)&(__return_storage_ptr__->internal).d.
              super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
              .
              super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
              .
              super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
              .
              super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
              .
              super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = lVar10 * iVar13;
    _Var5 = '\x05';
  }
  else {
    if ((chaiscript *)local_d0._M_string_length == (chaiscript *)0x0) {
      dVar19 = 0.0;
    }
    else {
      pcVar15 = (chaiscript *)0x0;
      lVar10 = 0;
      do {
        if (9 < (byte)(local_d0._M_dataplus._M_p[(long)pcVar15] - 0x30U)) break;
        lVar10 = (ulong)((byte)local_d0._M_dataplus._M_p[(long)pcVar15] & 0xf) + lVar10 * 10;
        pcVar15 = pcVar15 + 1;
      } while ((chaiscript *)local_d0._M_string_length != pcVar15);
      dVar19 = (double)lVar10;
    }
    dVar18 = pow(10.0,dVar18);
    *(double *)
     &(__return_storage_ptr__->internal).d.
      super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      .
      super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = dVar18 * dVar19 * (double)iVar13;
    _Var5 = '\x04';
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x20) = _Var5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_number(const std::string &str, size_t &offset) {
      std::string val, exp_str;
      char c = '\0';
      bool isDouble = false;
      bool isNegative = false;
      std::int64_t exp = 0;
      bool isExpNegative = false;
      if (offset < str.size() && str.at(offset) == '-') {
        isNegative = true;
        ++offset;
      }
      for (; offset < str.size();) {
        c = str.at(offset++);
        if (c >= '0' && c <= '9') {
          val += c;
        } else if (c == '.' && !isDouble) {
          val += c;
          isDouble = true;
        } else {
          break;
        }
      }
      if (offset < str.size() && (c == 'E' || c == 'e')) {
        c = str.at(offset++);
        if (c == '-') {
          isExpNegative = true;
        } else if (c == '+') {
          // do nothing
        } else {
          --offset;
        }

        for (; offset < str.size();) {
          c = str.at(offset++);
          if (c >= '0' && c <= '9') {
            exp_str += c;
          } else if (!isspace(c) && c != ',' && c != ']' && c != '}') {
            throw std::runtime_error(std::string("JSON ERROR: Number: Expected a number for exponent, found '") + c + "'");
          } else {
            break;
          }
        }
        exp = chaiscript::parse_num<std::int64_t>(exp_str) * (isExpNegative ? -1 : 1);
      } else if (offset < str.size() && (!isspace(c) && c != ',' && c != ']' && c != '}')) {
        throw std::runtime_error(std::string("JSON ERROR: Number: unexpected character '") + c + "'");
      }
      --offset;

      if (isDouble) {
        return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<double>(val) * std::pow(10, exp));
      } else {
        if (!exp_str.empty()) {
          return JSON((isNegative ? -1 : 1) * static_cast<double>(chaiscript::parse_num<std::int64_t>(val)) * std::pow(10, exp));
        } else {
          return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<std::int64_t>(val));
        }
      }
    }